

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdNode.cpp
# Opt level: O0

FindResult * __thiscall
KdNode::findInTriangles
          (FindResult *__return_storage_ptr__,KdNode *this,Segment seg,Triangle *excludedTriangle,
          float t_enter,float t_exit)

{
  bool bVar1;
  IntersecRes local_64;
  IntersecRes *local_50;
  IntersecRes *intersec;
  Triangle *triangle;
  iterator __end1;
  iterator __begin1;
  vector<Triangle,_std::allocator<Triangle>_> *__range1;
  float currDist;
  float t_exit_local;
  float t_enter_local;
  Triangle *excludedTriangle_local;
  KdNode *this_local;
  
  __return_storage_ptr__->exists = false;
  (__return_storage_ptr__->triangle).x.x = 0.0;
  (__return_storage_ptr__->triangle).x.y = 0.0;
  (__return_storage_ptr__->triangle).x.z = 0.0;
  (__return_storage_ptr__->triangle).y.x = 0.0;
  (__return_storage_ptr__->triangle).y.y = 0.0;
  (__return_storage_ptr__->triangle).y.z = 0.0;
  (__return_storage_ptr__->triangle).z.x = 0.0;
  (__return_storage_ptr__->triangle).z.y = 0.0;
  (__return_storage_ptr__->triangle).z.z = 0.0;
  (__return_storage_ptr__->triangle).colorX.r = '\0';
  (__return_storage_ptr__->triangle).colorX.g = '\0';
  (__return_storage_ptr__->triangle).colorX.b = '\0';
  (__return_storage_ptr__->triangle).colorY.r = '\0';
  (__return_storage_ptr__->triangle).colorY.g = '\0';
  (__return_storage_ptr__->triangle).colorY.b = '\0';
  (__return_storage_ptr__->triangle).colorZ.r = '\0';
  (__return_storage_ptr__->triangle).colorZ.g = '\0';
  (__return_storage_ptr__->triangle).colorZ.b = '\0';
  (__return_storage_ptr__->triangle).normal.x = 0.0;
  (__return_storage_ptr__->triangle).normal.y = 0.0;
  (__return_storage_ptr__->triangle).normal.z = 0.0;
  (__return_storage_ptr__->triangle).reflectionCoefficient = 0.1;
  (__return_storage_ptr__->point).x = 0.0;
  (__return_storage_ptr__->point).y = 0.0;
  (__return_storage_ptr__->point).z = 0.0;
  __range1._4_4_ = std::numeric_limits<float>::max();
  __end1 = std::vector<Triangle,_std::allocator<Triangle>_>::begin(&this->triangles);
  triangle = (Triangle *)std::vector<Triangle,_std::allocator<Triangle>_>::end(&this->triangles);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Triangle_*,_std::vector<Triangle,_std::allocator<Triangle>_>_>
                                     *)&triangle), bVar1) {
    intersec = (IntersecRes *)
               __gnu_cxx::
               __normal_iterator<Triangle_*,_std::vector<Triangle,_std::allocator<Triangle>_>_>::
               operator*(&__end1);
    bVar1 = Triangle::operator==((Triangle *)intersec,excludedTriangle);
    if (!bVar1) {
      intersectionT(&local_64,&seg,(Triangle *)intersec);
      local_50 = &local_64;
      if (((((local_64.exists & 1U) != 0) && (local_64.t < __range1._4_4_)) &&
          (t_enter <= local_64.t)) && (local_64.t <= t_exit)) {
        __range1._4_4_ = local_64.t;
        __return_storage_ptr__->exists = true;
        (__return_storage_ptr__->point).x = local_64.point.x;
        (__return_storage_ptr__->point).y = local_64.point.y;
        (__return_storage_ptr__->point).z = local_64.point.z;
        memcpy(&__return_storage_ptr__->triangle,intersec,0x40);
      }
    }
    __gnu_cxx::__normal_iterator<Triangle_*,_std::vector<Triangle,_std::allocator<Triangle>_>_>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

FindResult KdNode::findInTriangles(Segment seg, Triangle const& excludedTriangle, float t_enter, float t_exit)
{
  FindResult res{};

  float currDist = std::numeric_limits<float>::max();

  for (auto const& triangle : triangles)
  {
    if (triangle == excludedTriangle)
      continue;
    IntersecRes const& intersec = intersectionT(seg, triangle);

    if (intersec.exists && intersec.t < currDist && intersec.t >= t_enter && intersec.t <= t_exit)
    {
      currDist = intersec.t;
      res.exists = true;
      res.point = intersec.point;
      res.triangle = triangle;
    }
  }

  return res;
}